

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O2

void __thiscall
leveldb::VersionEdit::SetCompactPointer(VersionEdit *this,int level,InternalKey *key)

{
  undefined1 local_38 [40];
  
  local_38._0_4_ = level;
  std::__cxx11::string::string((string *)(local_38 + 8),(string *)key);
  std::
  vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>::
  emplace_back<std::pair<int,leveldb::InternalKey>>
            ((vector<std::pair<int,leveldb::InternalKey>,std::allocator<std::pair<int,leveldb::InternalKey>>>
              *)&this->compact_pointers_,(pair<int,_leveldb::InternalKey> *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  return;
}

Assistant:

void SetCompactPointer(int level, const InternalKey& key) {
    compact_pointers_.push_back(std::make_pair(level, key));
  }